

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastUnknownEnumFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  uint uVar6;
  char *pcVar7;
  ushort *puVar8;
  uint *puVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  ParseContext *ctx_00;
  
  bVar1 = *ptr;
  pVar10.second._0_1_ = bVar1;
  pVar10.first = ptr + 1;
  pVar10._9_7_ = 0;
  if ((char)bVar1 < '\0') {
    bVar2 = ptr[1];
    aVar5.data = (ulong)bVar2 << 7;
    uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
    if ((char)bVar2 < '\0') {
      pcVar3 = (char *)(ulong)uVar6;
      pVar10 = ReadTagFallback(ptr,uVar6);
      ctx_00 = pVar10._8_8_;
      if (pVar10.first == (char *)0x0) goto LAB_00151138;
    }
    else {
      pVar10.second = uVar6;
      pVar10.first = ptr + 2;
      pVar10._12_4_ = 0;
    }
  }
  ctx_00 = pVar10._8_8_;
  pcVar7 = pVar10.first;
  aVar5 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*pcVar7;
  if ((long)aVar5.data < 0) {
    uVar4 = (long)pcVar7[1] << 7 | 0x7f;
    if ((long)uVar4 < 0) {
      pcVar3 = (char *)((long)pcVar7[2] << 0xe | 0x3fff);
      if ((long)pcVar3 < 0) {
        uVar4 = uVar4 & ((long)pcVar7[3] << 0x15 | 0x1fffffU);
        if ((long)uVar4 < 0) {
          pcVar3 = (char *)((ulong)pcVar3 & ((long)pcVar7[4] << 0x1c | 0xfffffffU));
          if ((long)pcVar3 < 0) {
            uVar4 = uVar4 & ((long)pcVar7[5] << 0x23 | 0x7ffffffffU);
            if ((long)uVar4 < 0) {
              pcVar3 = (char *)((ulong)pcVar3 & ((long)pcVar7[6] << 0x2a | 0x3ffffffffffU));
              if ((long)pcVar3 < 0) {
                uVar4 = uVar4 & ((long)pcVar7[7] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar4 < 0) {
                  pcVar3 = (char *)((ulong)pcVar3 &
                                   ((ulong)(byte)pcVar7[8] << 0x38 | 0xffffffffffffff));
                  if ((long)pcVar3 < 0) {
                    puVar8 = (ushort *)(pcVar7 + 10);
                    if ((pcVar7[9] != '\x01') && (pcVar7[9] < '\0')) {
LAB_00151138:
                      pcVar3 = Error(msg,pcVar3,ctx_00,(TcFieldData)aVar5,table,hasbits);
                      return pcVar3;
                    }
                  }
                  else {
                    puVar8 = (ushort *)(pcVar7 + 9);
                  }
                }
                else {
                  puVar8 = (ushort *)(pcVar7 + 8);
                }
              }
              else {
                puVar8 = (ushort *)(pcVar7 + 7);
              }
            }
            else {
              puVar8 = (ushort *)(pcVar7 + 6);
            }
          }
          else {
            puVar8 = (ushort *)(pcVar7 + 5);
          }
        }
        else {
          puVar8 = (ushort *)(pcVar7 + 4);
        }
      }
      else {
        puVar8 = (ushort *)(pcVar7 + 3);
      }
      uVar4 = uVar4 & (ulong)pcVar3;
    }
    else {
      puVar8 = (ushort *)(pcVar7 + 2);
    }
    aVar5.data = aVar5.data & uVar4;
  }
  else {
    puVar8 = (ushort *)(pcVar7 + 1);
  }
  AddUnknownEnum(msg,table,pVar10.second,(int32_t)aVar5.data);
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar8) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar9 & 3) != 0) {
        AlignFail(puVar9);
      }
      *puVar9 = *puVar9 | (uint)hasbits;
    }
    return (char *)puVar8;
  }
  uVar6 = (uint)table->fast_idx_mask & (uint)*puVar8;
  if ((uVar6 & 7) == 0) {
    uVar4 = (ulong)(uVar6 & 0xfffffff8);
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar8,ctx,
                                (ulong)*puVar8 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits);
    return pcVar3;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUnknownEnumFallback(
    PROTOBUF_TC_PARAM_DECL) {
  // Skip MiniParse/fallback and insert the element directly into the unknown
  // field set. We also normalize the value into an int32 as we do for known
  // enum values.
  uint32_t tag;
  ptr = ReadTag(ptr, &tag);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  AddUnknownEnum(msg, table, tag, static_cast<int32_t>(tmp));
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}